

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

void __thiscall QRhiWidget::resizeEvent(QRhiWidget *this,QResizeEvent *e)

{
  QWidgetPrivate *this_00;
  QSize QVar1;
  long in_FS_OFFSET;
  QRect local_30;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if ((*(int *)(e + 0x10) < 1) || (*(int *)(e + 0x14) < 1)) {
    this_00[1].field_0x8 = 1;
  }
  else {
    this_00[1].field_0x8 = 0;
    QVar1 = QWidget::size(&this->super_QWidget);
    local_30.x2.m_i = QVar1.wd.m_i.m_i + -1;
    local_30.x1.m_i = 0;
    local_30.y1.m_i = 0;
    local_30.y2.m_i = QVar1.ht.m_i.m_i + -1;
    QRegion::QRegion(&local_20,&local_30,Rectangle);
    QWidgetPrivate::sendPaintEvent(this_00,&local_20);
    QRegion::~QRegion(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiWidget::resizeEvent(QResizeEvent *e)
{
    Q_D(QRhiWidget);

    if (e->size().isEmpty()) {
        d->noSize = true;
        return;
    }
    d->noSize = false;

    d->sendPaintEvent(QRect(QPoint(0, 0), size()));
}